

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluNativeDisplay.cpp
# Opt level: O2

void __thiscall eglu::NativeDisplay::~NativeDisplay(NativeDisplay *this)

{
  this->_vptr_NativeDisplay = (_func_int **)&PTR__NativeDisplay_00a061f0;
  std::__cxx11::string::~string((string *)&this->m_platformExtension);
  return;
}

Assistant:

NativeDisplay::~NativeDisplay (void)
{
}